

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::json_abi_v3_11_2::detail::
iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
::iteration_proxy_value
          (iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *this,iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *it,size_t array_index_)

{
  pointer pbVar1;
  _Base_ptr p_Var2;
  difference_type dVar3;
  allocator local_9;
  
  pbVar1 = it->m_object;
  p_Var2 = (it->m_it).object_iterator._M_node;
  dVar3 = (it->m_it).primitive_iterator.m_it;
  (this->anchor).m_it.array_iterator._M_current = (it->m_it).array_iterator._M_current;
  (this->anchor).m_it.primitive_iterator.m_it = dVar3;
  (this->anchor).m_object = pbVar1;
  (this->anchor).m_it.object_iterator._M_node = p_Var2;
  this->array_index = array_index_;
  this->array_index_last = 0;
  std::__cxx11::string::string((string *)&this->array_index_str,"0",&local_9);
  (this->empty_str)._M_dataplus._M_p = (pointer)&(this->empty_str).field_2;
  (this->empty_str)._M_string_length = 0;
  (this->empty_str).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit iteration_proxy_value(IteratorType it, std::size_t array_index_ = 0)
    noexcept(std::is_nothrow_move_constructible<IteratorType>::value
             && std::is_nothrow_default_constructible<string_type>::value)
        : anchor(std::move(it))
        , array_index(array_index_)
    {}